

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_ReadWriteSettings::test_method(util_ReadWriteSettings *this)

{
  long lVar1;
  string message;
  MatchFn match;
  mapped_type *pmVar2;
  string *psVar3;
  char *p2;
  char *p2_00;
  char *p2_01;
  iterator pvVar4;
  iterator pvVar5;
  path *this_00;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined8 in_stack_fffffffffffff9f8;
  char *pcVar6;
  _Manager_type p_Var7;
  _Invoker_type p_Var8;
  char *local_5e0;
  char *local_5d8;
  unique_lock<std::recursive_mutex> local_5d0;
  path local_5c0;
  path local_598;
  path local_570;
  path local_548;
  string local_520 [32];
  DebugLogHelper debugloghelper25;
  TestArgsManager args2;
  TestArgsManager args1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager(&args1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&args2,"-datadir",(allocator<char> *)&local_548);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root;
  std::filesystem::__cxx11::path::string(&debugloghelper25.m_message,&this_00->super_path);
  ArgsManager::ForceSetArg(&args1.super_ArgsManager,(string *)&args2,&debugloghelper25.m_message);
  std::__cxx11::string::~string((string *)&debugloghelper25);
  std::__cxx11::string::~string((string *)&args2);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_548,
             (AnnotatedMixin<std::recursive_mutex> *)&args1,"cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.h"
             ,0x19f,false);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>((UniValue *)&args2,(char (*) [6])0xb479b3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debugloghelper25,"name",(allocator<char> *)&local_5e0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           ::operator[](&args1.super_ArgsManager.m_settings.rw_settings,&debugloghelper25.m_message)
  ;
  UniValue::operator=(pmVar2,(UniValue *)&args2);
  std::__cxx11::string::~string((string *)&debugloghelper25);
  UniValue::~UniValue((UniValue *)&args2);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_548);
  ArgsManager::WriteSettingsFile
            (&args1.super_ArgsManager,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0,false);
  TestArgsManager::TestArgsManager(&args2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debugloghelper25,"-datadir",(allocator<char> *)&local_5e0);
  std::filesystem::__cxx11::path::string((string *)&local_548,&this_00->super_path);
  ArgsManager::ForceSetArg
            (&args2.super_ArgsManager,&debugloghelper25.m_message,(string *)&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&debugloghelper25);
  ArgsManager::ReadSettingsFile
            (&args2.super_ArgsManager,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  pvVar4 = (iterator)0x19f;
  pvVar5 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_5d0,
             (AnnotatedMixin<std::recursive_mutex> *)&args2,"cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.h"
             ,0x19f,false);
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5d8 = "";
  p_Var8 = (_Invoker_type)&boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar5;
  msg.m_begin = pvVar4;
  file.m_end = (iterator)0x412;
  file.m_begin = (iterator)&local_5e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
             (size_t)&stack0xfffffffffffffa10,msg);
  debugloghelper25.m_message._M_string_length._0_1_ = 0;
  debugloghelper25.m_message._M_dataplus._M_p = "<W\x1b";
  debugloghelper25.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper25.m_message.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  p_Var7 = (_Manager_type)0xb523bf;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"name",(allocator<char> *)&stack0xfffffffffffff9ff);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           ::operator[](&args2.super_ArgsManager.m_settings.rw_settings,(key_type *)&local_548);
  psVar3 = UniValue::get_str_abi_cxx11_(pmVar2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (&debugloghelper25,&stack0xfffffffffffffa00,0x412,1,2,psVar3,
             "settings.rw_settings[\"name\"].get_str()","value","\"value\"");
  std::__cxx11::string::~string((string *)&local_548);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_520,"Failed renaming settings file",(allocator<char> *)&local_548);
  message.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
       ::_M_manager;
  message._M_dataplus._M_p = (pointer)0x0;
  message._M_string_length = 0;
  message.field_2._8_8_ =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
       ::_M_invoke;
  match.super__Function_base._M_functor._8_8_ = pcVar6;
  match.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffff9f8;
  match.super__Function_base._M_manager = p_Var7;
  match._M_invoker = p_Var8;
  DebugLogHelper::DebugLogHelper(&debugloghelper25,message,match);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff9d8);
  std::__cxx11::string::~string(local_520);
  ArgsManager::GetDataDirBase((path *)&local_570,&args1.super_ArgsManager);
  fs::operator/((path *)&local_548,(path *)&local_570,p2);
  std::filesystem::remove(&local_548);
  std::filesystem::__cxx11::path::~path((path *)&local_548);
  std::filesystem::__cxx11::path::~path(&local_570);
  ArgsManager::GetDataDirBase((path *)&local_598,&args1.super_ArgsManager);
  fs::operator/((path *)&local_548,(path *)&local_598,p2_00);
  std::filesystem::create_directory(&local_548);
  std::filesystem::__cxx11::path::~path((path *)&local_548);
  std::filesystem::__cxx11::path::~path(&local_598);
  ArgsManager::WriteSettingsFile
            (&args2.super_ArgsManager,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0,false);
  ArgsManager::GetDataDirBase((path *)&local_5c0,&args1.super_ArgsManager);
  fs::operator/((path *)&local_548,(path *)&local_5c0,p2_01);
  std::filesystem::remove(&local_548);
  std::filesystem::__cxx11::path::~path((path *)&local_548);
  std::filesystem::__cxx11::path::~path(&local_5c0);
  DebugLogHelper::~DebugLogHelper(&debugloghelper25);
  ArgsManager::~ArgsManager(&args2.super_ArgsManager);
  ArgsManager::~ArgsManager(&args1.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReadWriteSettings)
{
    // Test writing setting.
    TestArgsManager args1;
    args1.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    args1.LockSettings([&](common::Settings& settings) { settings.rw_settings["name"] = "value"; });
    args1.WriteSettingsFile();

    // Test reading setting.
    TestArgsManager args2;
    args2.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    args2.ReadSettingsFile();
    args2.LockSettings([&](common::Settings& settings) { BOOST_CHECK_EQUAL(settings.rw_settings["name"].get_str(), "value"); });

    // Test error logging, and remove previously written setting.
    {
        ASSERT_DEBUG_LOG("Failed renaming settings file");
        fs::remove(args1.GetDataDirBase() / "settings.json");
        fs::create_directory(args1.GetDataDirBase() / "settings.json");
        args2.WriteSettingsFile();
        fs::remove(args1.GetDataDirBase() / "settings.json");
    }
}